

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeGetEstLocalErrors(void *cvode_mem,N_Vector ele)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetEstLocalErrors","cvode_mem = NULL illegal.")
    ;
  }
  else {
    N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0xd8),ele);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetEstLocalErrors(void *cvode_mem, N_Vector ele)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetEstLocalErrors", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  N_VScale(ONE, cv_mem->cv_acor, ele);

  return(CV_SUCCESS);
}